

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O1

Vector<float,_4> __thiscall
deqp::gls::FragmentOpUtil::triQuadInterpolate<tcu::Vector<float,4>>
          (FragmentOpUtil *this,Vector<float,_4> *values,float xFactor,float yFactor)

{
  Vector<float,_4> *res_5;
  int i;
  long lVar1;
  float fVar2;
  undefined4 in_XMM1_Db;
  Vector<float,_4> VVar3;
  Vector<float,_4> res_3;
  Vector<float,_4> res_4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  
  VVar3.m_data[3] = (float)in_XMM1_Db;
  VVar3.m_data[2] = yFactor;
  if (1.0 <= xFactor + yFactor) {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res.m_data[lVar1] = values[1].m_data[lVar1] - values[3].m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_1.m_data[lVar1] = res.m_data[lVar1] * (1.0 - xFactor);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_2.m_data[lVar1] = values[3].m_data[lVar1] + res_1.m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_3.m_data[lVar1] = values[2].m_data[lVar1] - values[3].m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    res_4.m_data[2] = 0.0;
    res_4.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_4.m_data[lVar1] = res_3.m_data[lVar1] * (1.0 - yFactor);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar1 = 0;
    do {
      fVar2 = res_2.m_data[lVar1] + res_4.m_data[lVar1];
      *(float *)(this + lVar1 * 4) = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res.m_data[2] = 0.0;
    res.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res.m_data[lVar1] = values[2].m_data[lVar1] - values->m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_1.m_data[lVar1] = res.m_data[lVar1] * xFactor;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_2.m_data[lVar1] = values->m_data[lVar1] + res_1.m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_3.m_data[lVar1] = values[1].m_data[lVar1] - values->m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    res_4.m_data[2] = 0.0;
    res_4.m_data[3] = 0.0;
    lVar1 = 0;
    do {
      res_4.m_data[lVar1] = res_3.m_data[lVar1] * yFactor;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar1 = 0;
    do {
      fVar2 = res_2.m_data[lVar1] + res_4.m_data[lVar1];
      *(float *)(this + lVar1 * 4) = fVar2;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  VVar3.m_data[1] = 0.0;
  VVar3.m_data[0] = fVar2;
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

inline T triQuadInterpolate (const T values[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}